

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  char *pcVar1;
  undefined8 in_RAX;
  size_t sVar2;
  char *buf_ptr;
  undefined8 uStack_28;
  
  pcVar1 = *(char **)(days + (long)tm_time->tm_wday * 8);
  uStack_28 = in_RAX;
  sVar2 = strlen(pcVar1);
  ::fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar1,pcVar1 + sVar2);
  uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
  ::fmt::v7::detail::buffer<char>::push_back
            (&dest->super_buffer<char>,(char *)((long)&uStack_28 + 7));
  pcVar1 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar2 = strlen(pcVar1);
  ::fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar1,pcVar1 + sVar2);
  uStack_28._0_7_ = CONCAT16(0x20,(undefined6)uStack_28);
  ::fmt::v7::detail::buffer<char>::push_back
            (&dest->super_buffer<char>,(char *)((long)&uStack_28 + 6));
  fmt_helper::append_int<int>(tm_time->tm_mday,dest);
  uStack_28._0_6_ = CONCAT15(0x20,(undefined5)uStack_28);
  ::fmt::v7::detail::buffer<char>::push_back
            (&dest->super_buffer<char>,(char *)((long)&uStack_28 + 5));
  fmt_helper::pad2(tm_time->tm_hour,dest);
  uStack_28._0_5_ = CONCAT14(0x3a,(undefined4)uStack_28);
  ::fmt::v7::detail::buffer<char>::push_back
            (&dest->super_buffer<char>,(char *)((long)&uStack_28 + 4));
  fmt_helper::pad2(tm_time->tm_min,dest);
  uStack_28._0_4_ = CONCAT13(0x3a,(undefined3)uStack_28);
  ::fmt::v7::detail::buffer<char>::push_back
            (&dest->super_buffer<char>,(char *)((long)&uStack_28 + 3));
  fmt_helper::pad2(tm_time->tm_sec,dest);
  uStack_28._0_3_ = CONCAT12(0x20,(undefined2)uStack_28);
  ::fmt::v7::detail::buffer<char>::push_back
            (&dest->super_buffer<char>,(char *)((long)&uStack_28 + 2));
  fmt_helper::append_int<int>(tm_time->tm_year + 0x76c,dest);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }